

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adksys_procfs.c
# Opt level: O1

int adksys_get_cmdline_buffer(char **output_buffer,int *output_size)

{
  ulong uVar1;
  int iVar2;
  FILE *__stream;
  char *__s;
  int *piVar3;
  size_t sVar4;
  ulong uVar5;
  
  __stream = fopen("/proc/self/cmdline","r");
  if (__stream != (FILE *)0x0) {
    iVar2 = feof(__stream);
    sVar4 = 0;
    while (iVar2 == 0) {
      fgetc(__stream);
      sVar4 = sVar4 + 1;
      iVar2 = feof(__stream);
    }
    __s = (char *)malloc(sVar4);
    if (__s != (char *)0x0) {
      uVar1 = sVar4 - 1;
      uVar5 = 0;
      memset(__s,0,sVar4);
      fseek(__stream,0,0);
      do {
        sVar4 = fread(__s + uVar5,1,uVar1 - uVar5,__stream);
        if (sVar4 == 0) {
          piVar3 = __errno_location();
          if (*piVar3 != 4) {
            iVar2 = feof(__stream);
            if (iVar2 == 0) goto LAB_00107b83;
            break;
          }
        }
        else {
          uVar5 = uVar5 + sVar4;
        }
      } while (uVar5 < uVar1);
      fclose(__stream);
      *output_buffer = __s;
      *output_size = (int)uVar1;
      return 0;
    }
  }
  __s = (char *)0x0;
LAB_00107b83:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (__s != (char *)0x0) {
    free(__s);
  }
  return -1;
}

Assistant:

int adksys_get_cmdline_buffer(char **output_buffer, int *output_size)
{
   FILE *f = NULL;
   size_t bytes_read = 0, size = 0;
   char *buffer = NULL;
   size_t result;
   
   f = fopen("/proc/self/cmdline", "r");
   if (!f)
      goto error;
   while (!feof(f)) {
      fgetc(f);
      size += 1;
   }
   size--;
   buffer = (char *) malloc(size+1);
   if (!buffer)
      goto error;
   memset(buffer, 0, size+1);
   
   result = fseek(f, SEEK_SET, 0);
   do {
      result = fread(buffer + bytes_read, 1, size - bytes_read, f);
      if (result == 0 && errno == EINTR)
         continue;
      else if (result == 0 && feof(f))
         break;
      else if (result == 0)
         goto error;
      bytes_read += result;
   } while (bytes_read < size);

   fclose(f);
   *output_buffer = buffer;
   *output_size = size;
   return 0;
   
  error:
   if (f)
      fclose(f);
   if (buffer)
      free(buffer);
   return -1;
}